

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

ConstNodeRef __thiscall c4::yml::Tree::operator[](Tree *this,size_t i)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  ConstNodeRef CVar10;
  char msg [68];
  char msg_1 [27];
  char local_88 [24];
  char *pcStack_70;
  undefined8 local_68;
  undefined4 local_48;
  char local_38 [32];
  
  bVar9 = 0;
  sVar5 = root_id(this);
  if (sVar5 == 0xffffffffffffffff) {
    pcVar7 = "check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)";
    pcVar8 = local_88;
    for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar9 * -2 + 1) * 8;
      pcVar8 = pcVar8 + ((ulong)bVar9 * -2 + 1) * 8;
    }
    local_48 = 0x29454e;
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        CVar10 = (ConstNodeRef)(*pcVar1)();
        return CVar10;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x50ba) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x50ba) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_88,0x44,LVar2,(this->m_callbacks).m_user_data);
  }
  sVar5 = child(this,sVar5,i);
  if (sVar5 == 0xffffffffffffffff) {
    builtin_strncpy(local_38 + 0x10,"h != NONE)",0xb);
    builtin_strncpy(local_38,"check failed: (c",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        CVar10 = (ConstNodeRef)(*pcVar1)();
        return CVar10;
      }
    }
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = -0x44;
    local_88[9] = 'P';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    pcStack_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x50bc) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x50bc) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_38,0x1b,LVar3,(this->m_callbacks).m_user_data);
  }
  CVar10.m_id = sVar5;
  CVar10.m_tree = this;
  return CVar10;
}

Assistant:

ConstNodeRef Tree::operator[] (size_t i) const
{
    return rootref()[i];
}